

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * re2::SimplifyWalker::SimplifyCharClass(Regexp *re)

{
  bool bVar1;
  ParseFlags PVar2;
  CharClass *this;
  CharClass *cc;
  Regexp *re_local;
  
  this = Regexp::cc(re);
  bVar1 = CharClass::empty(this);
  if (bVar1) {
    re_local = (Regexp *)operator_new((size_t)this);
    PVar2 = Regexp::parse_flags(re);
    Regexp::Regexp(re_local,kRegexpNoMatch,PVar2);
  }
  else {
    bVar1 = CharClass::full(this);
    if (bVar1) {
      re_local = (Regexp *)operator_new((size_t)this);
      PVar2 = Regexp::parse_flags(re);
      Regexp::Regexp(re_local,kRegexpAnyChar,PVar2);
    }
    else {
      re_local = Regexp::Incref(re);
    }
  }
  return re_local;
}

Assistant:

Regexp* SimplifyWalker::SimplifyCharClass(Regexp* re) {
  CharClass* cc = re->cc();

  // Special cases
  if (cc->empty())
    return new Regexp(kRegexpNoMatch, re->parse_flags());
  if (cc->full())
    return new Regexp(kRegexpAnyChar, re->parse_flags());

  return re->Incref();
}